

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32 tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  bool bVar1;
  undefined1 uVar2;
  WireType WVar3;
  WireType WVar4;
  Type TVar5;
  int32 iVar6;
  int iVar7;
  Syntax SVar8;
  int32 iVar9;
  int64 iVar10;
  Descriptor *this;
  FileDescriptor *this_00;
  CodedInputStream *in_RCX;
  CodedInputStream *in_RDX;
  CodedInputStream *in_RSI;
  uint32 in_EDI;
  float fVar11;
  float fVar12;
  double dVar13;
  Message *sub_message_1;
  Message *sub_message;
  string value_29;
  string value_28;
  bool strict_utf8_check;
  int value_27;
  bool value_26;
  double value_25;
  float value_24;
  int64 value_23;
  int32 value_22;
  uint64 value_21;
  uint32 value_20;
  uint64 value_19;
  uint32 value_18;
  int64 value_17;
  int32 value_16;
  int64 value_15;
  int32 value_14;
  int64 sign_extended_value;
  EnumValueDescriptor *enum_value;
  int value_13;
  bool value_12;
  double value_11;
  float value_10;
  int64 value_9;
  int32 value_8;
  uint64 value_7;
  uint32 value_6;
  uint64 value_5;
  uint32 value_4;
  int64 value_3;
  int32 value_2;
  int64 value_1;
  int32 value;
  Limit limit;
  uint32 length;
  anon_enum_32 value_format;
  Reflection *message_reflection;
  uint32 temp_19;
  uint32 temp_9;
  uint32 temp_10;
  uint32 temp;
  uint64 temp_11;
  uint64 temp_1;
  uint32 temp_12;
  uint32 temp_2;
  uint64 temp_13;
  uint64 temp_3;
  uint32 temp_14;
  uint32 temp_4;
  uint64 temp_15;
  uint64 temp_5;
  uint32 temp_16;
  uint32 temp_6;
  uint64 temp_17;
  uint64 temp_7;
  uint64 temp_18;
  uint64 temp_8;
  string *in_stack_fffffffffffff9e8;
  CodedInputStream *in_stack_fffffffffffff9f0;
  CodedInputStream *in_stack_fffffffffffff9f8;
  uint32 uVar14;
  CodedInputStream *in_stack_fffffffffffffa00;
  CodedInputStream *in_stack_fffffffffffffa08;
  Reflection *in_stack_fffffffffffffa10;
  CodedInputStream *in_stack_fffffffffffffa18;
  Reflection *in_stack_fffffffffffffa20;
  Reflection *in_stack_fffffffffffffa28;
  Message *in_stack_fffffffffffffa30;
  CodedInputStream *in_stack_fffffffffffffa38;
  string *in_stack_fffffffffffffa48;
  FieldDescriptor *in_stack_fffffffffffffa50;
  Message *in_stack_fffffffffffffa58;
  Reflection *in_stack_fffffffffffffa60;
  Reflection *this_01;
  FieldDescriptor *in_stack_fffffffffffffa68;
  Message *in_stack_fffffffffffffa70;
  undefined7 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7f;
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  int local_408;
  string local_3f8 [39];
  byte local_3d1;
  undefined4 local_3d0;
  undefined1 local_3c9;
  double local_3c8;
  float local_3bc;
  undefined8 local_3b8;
  undefined4 local_3ac;
  undefined1 local_3a8 [12];
  undefined1 local_39c [4];
  undefined1 local_398 [12];
  undefined1 local_38c [4];
  int64 local_388;
  int32 local_37c;
  undefined8 local_378;
  undefined4 local_36c;
  long local_368;
  EnumValueDescriptor *local_360;
  int local_358;
  undefined1 local_351;
  double local_350;
  float local_344;
  undefined8 local_340;
  undefined4 local_334;
  undefined1 local_330 [12];
  undefined1 local_324 [4];
  undefined1 local_320 [12];
  undefined1 local_314 [4];
  int64 local_310;
  int32 local_304;
  undefined8 local_300;
  undefined4 local_2f8;
  Limit local_2f4;
  int local_2ec;
  Reflection *local_2e8;
  CodedInputStream *local_2e0;
  CodedInputStream *local_2d8;
  CodedInputStream *local_2d0;
  uint32 local_2c4;
  byte local_2bd;
  undefined4 local_2bc;
  undefined4 *local_2b8;
  CodedInputStream *local_2b0;
  undefined1 local_2a5;
  int local_2a4;
  int *local_2a0;
  CodedInputStream *local_298;
  undefined1 local_28d;
  undefined4 local_28c;
  undefined4 *local_288;
  CodedInputStream *local_280;
  undefined1 local_275;
  undefined4 local_274;
  undefined4 *local_270;
  CodedInputStream *local_268;
  undefined1 local_259;
  undefined8 local_258;
  undefined8 *local_250;
  CodedInputStream *local_248;
  undefined1 local_239;
  undefined8 local_238;
  undefined8 *local_230;
  CodedInputStream *local_228;
  undefined1 local_21d;
  uint32 local_21c;
  int32 *local_218;
  CodedInputStream *local_210;
  undefined1 local_205;
  uint32 local_204;
  int32 *local_200;
  CodedInputStream *local_1f8;
  undefined1 local_1e9;
  uint64 local_1e8;
  int64 *local_1e0;
  CodedInputStream *local_1d8;
  undefined1 local_1c9;
  uint64 local_1c8;
  int64 *local_1c0;
  CodedInputStream *local_1b8;
  undefined1 local_1a9;
  undefined1 *local_1a8;
  CodedInputStream *local_1a0;
  undefined1 *local_198;
  CodedInputStream *local_190;
  undefined1 *local_188;
  CodedInputStream *local_180;
  undefined1 *local_178;
  CodedInputStream *local_170;
  undefined1 *local_168;
  CodedInputStream *local_160;
  undefined1 *local_158;
  CodedInputStream *local_150;
  undefined1 *local_148;
  CodedInputStream *local_140;
  undefined1 *local_138;
  CodedInputStream *local_130;
  undefined4 local_124;
  undefined4 *local_120;
  CodedInputStream *local_118;
  undefined1 local_10d;
  undefined4 local_10c;
  undefined4 *local_108;
  CodedInputStream *local_100;
  undefined1 local_f1;
  undefined8 local_f0;
  undefined8 *local_e8;
  CodedInputStream *local_e0;
  undefined1 local_d1;
  undefined8 local_d0;
  undefined8 *local_c8;
  CodedInputStream *local_c0;
  undefined1 local_b5;
  uint32 local_b4;
  float *local_b0;
  CodedInputStream *local_a8;
  undefined1 local_9d;
  uint32 local_9c;
  float *local_98;
  CodedInputStream *local_90;
  undefined1 local_81;
  uint64 local_80;
  double *local_78;
  CodedInputStream *local_70;
  undefined1 local_61;
  uint64 local_60;
  double *local_58;
  CodedInputStream *local_50;
  undefined1 local_41;
  long local_40;
  undefined1 *local_38;
  CodedInputStream *local_30;
  undefined1 local_21;
  long local_20;
  undefined1 *local_18;
  CodedInputStream *local_10;
  undefined1 local_1;
  
  local_2e0 = in_RCX;
  local_2d8 = in_RDX;
  local_2d0 = in_RSI;
  local_2c4 = in_EDI;
  local_2e8 = Message::GetReflection((Message *)in_stack_fffffffffffff9f0);
  if (local_2d0 == (CodedInputStream *)0x0) {
    local_2ec = 0;
  }
  else {
    WVar3 = WireFormatLite::GetTagWireType(local_2c4);
    FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffa00);
    WVar4 = WireTypeForFieldType(0);
    if (WVar3 == WVar4) {
      local_2ec = 1;
    }
    else {
      bVar1 = FieldDescriptor::is_packable((FieldDescriptor *)in_stack_fffffffffffff9f0);
      if ((bVar1) &&
         (WVar3 = WireFormatLite::GetTagWireType(local_2c4), WVar3 == WIRETYPE_LENGTH_DELIMITED)) {
        local_2ec = 2;
      }
      else {
        local_2ec = 0;
      }
    }
  }
  if (local_2ec == 0) {
    Reflection::MutableUnknownFields
              ((Reflection *)in_stack_fffffffffffff9f0,(Message *)in_stack_fffffffffffff9e8);
    local_2bd = SkipField(in_stack_fffffffffffffa38,
                          (uint32)((ulong)in_stack_fffffffffffffa30 >> 0x20),
                          (UnknownFieldSet *)in_stack_fffffffffffffa28);
    goto LAB_00468af4;
  }
  if (local_2ec == 2) {
    bVar1 = io::CodedInputStream::ReadVarint32
                      (in_stack_fffffffffffffa08,(uint32 *)in_stack_fffffffffffffa00);
    if (!bVar1) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    local_2f4 = io::CodedInputStream::PushLimit
                          (in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20)
                          );
    TVar5 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffa00);
    switch(TVar5) {
    case TYPE_DOUBLE:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_50 = local_2e0;
        local_58 = &local_350;
        bVar1 = io::CodedInputStream::ReadLittleEndian64
                          (in_stack_fffffffffffff9f8,(uint64 *)in_stack_fffffffffffff9f0);
        if (!bVar1) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        dVar13 = WireFormatLite::DecodeDouble(local_60);
        *local_58 = dVar13;
        local_41 = bVar1;
        Reflection::AddDouble
                  (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                   (FieldDescriptor *)in_stack_fffffffffffffa10,(double)in_stack_fffffffffffffa08);
      }
      break;
    case TYPE_FLOAT:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_90 = local_2e0;
        local_98 = &local_344;
        bVar1 = io::CodedInputStream::ReadLittleEndian32
                          (in_stack_fffffffffffff9f8,(uint32 *)in_stack_fffffffffffff9f0);
        if (!bVar1) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        fVar11 = WireFormatLite::DecodeFloat(local_9c);
        *local_98 = fVar11;
        local_81 = bVar1;
        Reflection::AddFloat
                  (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                   (FieldDescriptor *)in_stack_fffffffffffffa10,
                   (float)((ulong)in_stack_fffffffffffffa08 >> 0x20));
      }
      break;
    case TYPE_INT64:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_228 = local_2e0;
        local_230 = &local_300;
        local_21d = io::CodedInputStream::ReadVarint64
                              (in_stack_fffffffffffffa18,(uint64 *)in_stack_fffffffffffffa10);
        if (!(bool)local_21d) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        *local_230 = local_238;
        Reflection::AddInt64
                  (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                   (FieldDescriptor *)in_stack_fffffffffffffa10,(int64)in_stack_fffffffffffffa08);
      }
      break;
    case TYPE_UINT64:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_170 = local_2e0;
        local_178 = local_320;
        bVar1 = io::CodedInputStream::ReadVarint64
                          (in_stack_fffffffffffffa18,(uint64 *)in_stack_fffffffffffffa10);
        if (!bVar1) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        Reflection::AddUInt64
                  (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                   (FieldDescriptor *)in_stack_fffffffffffffa10,(uint64)in_stack_fffffffffffffa08);
      }
      break;
    case TYPE_INT32:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_268 = local_2e0;
        local_270 = &local_2f8;
        local_259 = io::CodedInputStream::ReadVarint32
                              (in_stack_fffffffffffffa08,(uint32 *)in_stack_fffffffffffffa00);
        if (!(bool)local_259) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        *local_270 = local_274;
        Reflection::AddInt32
                  (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                   (FieldDescriptor *)in_stack_fffffffffffffa10,
                   (int32)((ulong)in_stack_fffffffffffffa08 >> 0x20));
      }
      break;
    case TYPE_FIXED64:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_130 = local_2e0;
        local_138 = local_330;
        bVar1 = io::CodedInputStream::ReadLittleEndian64
                          (in_stack_fffffffffffff9f8,(uint64 *)in_stack_fffffffffffff9f0);
        if (!bVar1) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        Reflection::AddUInt64
                  (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                   (FieldDescriptor *)in_stack_fffffffffffffa10,(uint64)in_stack_fffffffffffffa08);
      }
      break;
    case TYPE_FIXED32:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_150 = local_2e0;
        local_158 = local_324;
        bVar1 = io::CodedInputStream::ReadLittleEndian32
                          (in_stack_fffffffffffff9f8,(uint32 *)in_stack_fffffffffffff9f0);
        if (!bVar1) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        Reflection::AddUInt32
                  (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                   (FieldDescriptor *)in_stack_fffffffffffffa10,
                   (uint32)((ulong)in_stack_fffffffffffffa08 >> 0x20));
      }
      break;
    case TYPE_BOOL:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_10 = local_2e0;
        local_18 = &local_351;
        local_1 = io::CodedInputStream::ReadVarint64
                            (in_stack_fffffffffffffa18,(uint64 *)in_stack_fffffffffffffa10);
        if (!(bool)local_1) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        *local_18 = local_20 != 0;
        Reflection::AddBool(in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                            (FieldDescriptor *)in_stack_fffffffffffffa10,
                            SUB81((ulong)in_stack_fffffffffffffa08 >> 0x38,0));
      }
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      local_2bd = 0;
      goto LAB_00468af4;
    case TYPE_UINT32:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_190 = local_2e0;
        local_198 = local_314;
        bVar1 = io::CodedInputStream::ReadVarint32
                          (in_stack_fffffffffffffa08,(uint32 *)in_stack_fffffffffffffa00);
        if (!bVar1) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        Reflection::AddUInt32
                  (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                   (FieldDescriptor *)in_stack_fffffffffffffa10,
                   (uint32)((ulong)in_stack_fffffffffffffa08 >> 0x20));
      }
      break;
    case TYPE_ENUM:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_298 = local_2e0;
        local_2a0 = &local_358;
        local_28d = io::CodedInputStream::ReadVarint32
                              (in_stack_fffffffffffffa08,(uint32 *)in_stack_fffffffffffffa00);
        if (!(bool)local_28d) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        *local_2a0 = local_2a4;
        this = Message::GetDescriptor((Message *)in_stack_fffffffffffff9f0);
        this_00 = Descriptor::file(this);
        SVar8 = FileDescriptor::syntax(this_00);
        if (SVar8 == SYNTAX_PROTO3) {
          Reflection::AddEnumValue
                    (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                     (FieldDescriptor *)in_stack_fffffffffffffa00,
                     (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
        }
        else {
          FieldDescriptor::enum_type((FieldDescriptor *)in_stack_fffffffffffff9f0);
          local_360 = EnumDescriptor::FindValueByNumber
                                ((EnumDescriptor *)in_stack_fffffffffffff9f0,
                                 (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
          if (local_360 == (EnumValueDescriptor *)0x0) {
            local_368 = (long)local_358;
            Reflection::MutableUnknownFields
                      ((Reflection *)in_stack_fffffffffffff9f0,(Message *)in_stack_fffffffffffff9e8)
            ;
            WireFormatLite::GetTagFieldNumber(local_2c4);
            UnknownFieldSet::AddVarint
                      ((UnknownFieldSet *)in_stack_fffffffffffffa10,
                       (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                       (uint64)in_stack_fffffffffffffa00);
          }
          else {
            Reflection::AddEnum(in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                                (FieldDescriptor *)in_stack_fffffffffffffa10,
                                (EnumValueDescriptor *)in_stack_fffffffffffffa08);
          }
        }
      }
      break;
    case TYPE_SFIXED32:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_100 = local_2e0;
        local_108 = &local_334;
        local_f1 = io::CodedInputStream::ReadLittleEndian32
                             (in_stack_fffffffffffff9f8,(uint32 *)in_stack_fffffffffffff9f0);
        if (!(bool)local_f1) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        *local_108 = local_10c;
        Reflection::AddInt32
                  (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                   (FieldDescriptor *)in_stack_fffffffffffffa10,
                   (int32)((ulong)in_stack_fffffffffffffa08 >> 0x20));
      }
      break;
    case TYPE_SFIXED64:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_c0 = local_2e0;
        local_c8 = &local_340;
        local_b5 = io::CodedInputStream::ReadLittleEndian64
                             (in_stack_fffffffffffff9f8,(uint64 *)in_stack_fffffffffffff9f0);
        if (!(bool)local_b5) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        *local_c8 = local_d0;
        Reflection::AddInt64
                  (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                   (FieldDescriptor *)in_stack_fffffffffffffa10,(int64)in_stack_fffffffffffffa08);
      }
      break;
    case TYPE_SINT32:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_1f8 = local_2e0;
        local_200 = &local_304;
        bVar1 = io::CodedInputStream::ReadVarint32
                          (in_stack_fffffffffffffa08,(uint32 *)in_stack_fffffffffffffa00);
        if (!bVar1) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        iVar6 = WireFormatLite::ZigZagDecode32(local_204);
        *local_200 = iVar6;
        local_1e9 = bVar1;
        Reflection::AddInt32
                  (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                   (FieldDescriptor *)in_stack_fffffffffffffa10,
                   (int32)((ulong)in_stack_fffffffffffffa08 >> 0x20));
      }
      break;
    case MAX_TYPE:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffff9f8), 0 < iVar7) {
        local_1b8 = local_2e0;
        local_1c0 = &local_310;
        bVar1 = io::CodedInputStream::ReadVarint64
                          (in_stack_fffffffffffffa18,(uint64 *)in_stack_fffffffffffffa10);
        if (!bVar1) {
          local_2bd = 0;
          goto LAB_00468af4;
        }
        iVar10 = WireFormatLite::ZigZagDecode64(local_1c8);
        *local_1c0 = iVar10;
        local_1a9 = bVar1;
        Reflection::AddInt64
                  (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                   (FieldDescriptor *)in_stack_fffffffffffffa10,(int64)in_stack_fffffffffffffa08);
      }
    }
    io::CodedInputStream::PopLimit
              (in_stack_fffffffffffff9f0,(Limit)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
    goto LAB_00468aec;
  }
  TVar5 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffa00);
  switch(TVar5) {
  case TYPE_DOUBLE:
    local_70 = local_2e0;
    local_78 = &local_3c8;
    local_61 = io::CodedInputStream::ReadLittleEndian64
                         (in_stack_fffffffffffff9f8,(uint64 *)in_stack_fffffffffffff9f0);
    if (!(bool)local_61) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    dVar13 = WireFormatLite::DecodeDouble(local_80);
    *local_78 = dVar13;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4681ab);
    if (bVar1) {
      Reflection::AddDouble
                (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                 (FieldDescriptor *)in_stack_fffffffffffffa10,(double)in_stack_fffffffffffffa08);
    }
    else {
      Reflection::SetDouble
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,(double)in_stack_fffffffffffff9f8);
    }
    break;
  case TYPE_FLOAT:
    local_a8 = local_2e0;
    local_b0 = &local_3bc;
    local_9d = io::CodedInputStream::ReadLittleEndian32
                         (in_stack_fffffffffffff9f8,(uint32 *)in_stack_fffffffffffff9f0);
    fVar11 = (float)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
    if (!(bool)local_9d) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    fVar12 = WireFormatLite::DecodeFloat(local_b4);
    *local_b0 = fVar12;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4680ca);
    if (bVar1) {
      Reflection::AddFloat
                (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                 (FieldDescriptor *)in_stack_fffffffffffffa10,
                 (float)((ulong)in_stack_fffffffffffffa08 >> 0x20));
    }
    else {
      Reflection::SetFloat
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,fVar11);
    }
    break;
  case TYPE_INT64:
    local_248 = local_2e0;
    local_250 = &local_378;
    local_239 = io::CodedInputStream::ReadVarint64
                          (in_stack_fffffffffffffa18,(uint64 *)in_stack_fffffffffffffa10);
    if (!(bool)local_239) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    *local_250 = local_258;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4679dd);
    if (bVar1) {
      Reflection::AddInt64
                (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                 (FieldDescriptor *)in_stack_fffffffffffffa10,(int64)in_stack_fffffffffffffa08);
    }
    else {
      Reflection::SetInt64
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,(int64)in_stack_fffffffffffff9f8);
    }
    break;
  case TYPE_UINT64:
    local_180 = local_2e0;
    local_188 = local_398;
    bVar1 = io::CodedInputStream::ReadVarint64
                      (in_stack_fffffffffffffa18,(uint64 *)in_stack_fffffffffffffa10);
    if (!bVar1) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x467cec);
    if (bVar1) {
      Reflection::AddUInt64
                (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                 (FieldDescriptor *)in_stack_fffffffffffffa10,(uint64)in_stack_fffffffffffffa08);
    }
    else {
      Reflection::SetUInt64
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,(uint64)in_stack_fffffffffffff9f8);
    }
    break;
  case TYPE_INT32:
    local_280 = local_2e0;
    local_288 = &local_36c;
    local_275 = io::CodedInputStream::ReadVarint32
                          (in_stack_fffffffffffffa08,(uint32 *)in_stack_fffffffffffffa00);
    iVar6 = (int32)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
    if (!(bool)local_275) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    *local_288 = local_28c;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x467906);
    if (bVar1) {
      Reflection::AddInt32
                (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                 (FieldDescriptor *)in_stack_fffffffffffffa10,
                 (int32)((ulong)in_stack_fffffffffffffa08 >> 0x20));
    }
    else {
      Reflection::SetInt32
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,iVar6);
    }
    break;
  case TYPE_FIXED64:
    local_140 = local_2e0;
    local_148 = local_3a8;
    bVar1 = io::CodedInputStream::ReadLittleEndian64
                      (in_stack_fffffffffffff9f8,(uint64 *)in_stack_fffffffffffff9f0);
    if (!bVar1) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x467e3e);
    if (bVar1) {
      Reflection::AddUInt64
                (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                 (FieldDescriptor *)in_stack_fffffffffffffa10,(uint64)in_stack_fffffffffffffa08);
    }
    else {
      Reflection::SetUInt64
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,(uint64)in_stack_fffffffffffff9f8);
    }
    break;
  case TYPE_FIXED32:
    local_160 = local_2e0;
    local_168 = local_39c;
    bVar1 = io::CodedInputStream::ReadLittleEndian32
                      (in_stack_fffffffffffff9f8,(uint32 *)in_stack_fffffffffffff9f0);
    uVar14 = (uint32)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
    if (!bVar1) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x467d96);
    if (bVar1) {
      Reflection::AddUInt32
                (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                 (FieldDescriptor *)in_stack_fffffffffffffa10,
                 (uint32)((ulong)in_stack_fffffffffffffa08 >> 0x20));
    }
    else {
      Reflection::SetUInt32
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,uVar14);
    }
    break;
  case TYPE_BOOL:
    local_30 = local_2e0;
    local_38 = &local_3c9;
    local_21 = io::CodedInputStream::ReadVarint64
                         (in_stack_fffffffffffffa18,(uint64 *)in_stack_fffffffffffffa10);
    uVar2 = (undefined1)((ulong)in_stack_fffffffffffff9f8 >> 0x38);
    if (!(bool)local_21) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    *local_38 = local_40 != 0;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46828c);
    if (bVar1) {
      Reflection::AddBool(in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                          (FieldDescriptor *)in_stack_fffffffffffffa10,
                          SUB81((ulong)in_stack_fffffffffffffa08 >> 0x38,0));
    }
    else {
      Reflection::SetBool(in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                          (FieldDescriptor *)in_stack_fffffffffffffa00,(bool)uVar2);
    }
    break;
  case TYPE_STRING:
    local_3d1 = StrictUtf8Check((FieldDescriptor *)0x4683cd);
    std::__cxx11::string::string(local_3f8);
    bVar1 = WireFormatLite::ReadString(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    if (bVar1) {
      if ((local_3d1 & 1) == 0) {
        std::__cxx11::string::data();
        std::__cxx11::string::length();
        FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)local_2d0);
        std::__cxx11::string::c_str();
        VerifyUTF8StringNamedField
                  ((char *)in_stack_fffffffffffff9f0,(int)((ulong)in_stack_fffffffffffff9e8 >> 0x20)
                   ,(Operation)in_stack_fffffffffffff9e8,(char *)0x46855f);
      }
      else {
        std::__cxx11::string::data();
        std::__cxx11::string::length();
        FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)local_2d0);
        std::__cxx11::string::c_str();
        bVar1 = WireFormatLite::VerifyUtf8String
                          ((char *)in_stack_fffffffffffffa08,
                           (int)((ulong)in_stack_fffffffffffffa00 >> 0x20),
                           (Operation)in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8);
        if (!bVar1) {
          local_2bd = 0;
          local_408 = 1;
          goto LAB_004686da;
        }
      }
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x468570);
      if (bVar1) {
        std::__cxx11::string::string(local_428,local_3f8);
        Reflection::AddString
                  (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                   in_stack_fffffffffffffa48);
        std::__cxx11::string::~string(local_428);
      }
      else {
        std::__cxx11::string::string(local_448,local_3f8);
        Reflection::SetString
                  ((Reflection *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
                   in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                   (string *)in_stack_fffffffffffffa60);
        std::__cxx11::string::~string(local_448);
      }
      local_408 = 0x1f;
    }
    else {
      local_2bd = 0;
      local_408 = 1;
    }
LAB_004686da:
    std::__cxx11::string::~string(local_3f8);
    goto joined_r0x004688f7;
  case TYPE_GROUP:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x468923);
    iVar7 = (int)in_stack_fffffffffffffa00;
    if (bVar1) {
      io::CodedInputStream::GetExtensionFactory(local_2e0);
      Reflection::AddMessage
                (in_stack_fffffffffffffa28,(Message *)in_stack_fffffffffffffa20,
                 (FieldDescriptor *)in_stack_fffffffffffffa18,
                 (MessageFactory *)in_stack_fffffffffffffa10);
    }
    else {
      io::CodedInputStream::GetExtensionFactory(local_2e0);
      Reflection::MutableMessage
                ((Reflection *)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                 (FieldDescriptor *)local_2d0,(MessageFactory *)local_2d8);
    }
    WireFormatLite::GetTagFieldNumber(local_2c4);
    bVar1 = WireFormatLite::ReadGroup<google::protobuf::Message>
                      (iVar7,in_stack_fffffffffffff9f8,(Message *)in_stack_fffffffffffff9f0);
    if (!bVar1) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    break;
  case TYPE_MESSAGE:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x468a17);
    if (bVar1) {
      io::CodedInputStream::GetExtensionFactory(local_2e0);
      Reflection::AddMessage
                (in_stack_fffffffffffffa28,(Message *)in_stack_fffffffffffffa20,
                 (FieldDescriptor *)in_stack_fffffffffffffa18,(MessageFactory *)local_2d0);
    }
    else {
      io::CodedInputStream::GetExtensionFactory(local_2e0);
      Reflection::MutableMessage
                ((Reflection *)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                 (FieldDescriptor *)in_stack_fffffffffffffa28,
                 (MessageFactory *)in_stack_fffffffffffffa20);
      in_stack_fffffffffffff9f0 = local_2d8;
      in_stack_fffffffffffff9f8 = local_2d0;
    }
    bVar1 = WireFormatLite::ReadMessage<google::protobuf::Message>
                      (in_stack_fffffffffffff9f8,(Message *)in_stack_fffffffffffff9f0);
    if (!bVar1) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    break;
  case TYPE_BYTES:
    std::__cxx11::string::string(local_468);
    bVar1 = WireFormatLite::ReadBytes(in_stack_fffffffffffff9f8,(string *)in_stack_fffffffffffff9f0)
    ;
    if (bVar1) {
      uVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46878e);
      if ((bool)uVar2) {
        this_01 = local_2e8;
        std::__cxx11::string::string(local_488,local_468);
        Reflection::AddString
                  (this_01,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                   in_stack_fffffffffffffa48);
        std::__cxx11::string::~string(local_488);
      }
      else {
        std::__cxx11::string::string(local_4a8,local_468);
        Reflection::SetString
                  ((Reflection *)CONCAT17(uVar2,in_stack_fffffffffffffa78),in_stack_fffffffffffffa70
                   ,in_stack_fffffffffffffa68,(string *)in_stack_fffffffffffffa60);
        std::__cxx11::string::~string(local_4a8);
      }
      local_408 = 0x1f;
    }
    else {
      local_2bd = 0;
      local_408 = 1;
    }
    std::__cxx11::string::~string(local_468);
joined_r0x004688f7:
    if (local_408 == 1) goto LAB_00468af4;
    break;
  case TYPE_UINT32:
    local_1a0 = local_2e0;
    local_1a8 = local_38c;
    bVar1 = io::CodedInputStream::ReadVarint32
                      (in_stack_fffffffffffffa08,(uint32 *)in_stack_fffffffffffffa00);
    uVar14 = (uint32)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
    if (!bVar1) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x467c44);
    if (bVar1) {
      Reflection::AddUInt32
                (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                 (FieldDescriptor *)in_stack_fffffffffffffa10,
                 (uint32)((ulong)in_stack_fffffffffffffa08 >> 0x20));
    }
    else {
      Reflection::SetUInt32
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,uVar14);
    }
    break;
  case TYPE_ENUM:
    local_2b0 = local_2e0;
    local_2b8 = &local_3d0;
    local_2a5 = io::CodedInputStream::ReadVarint32
                          (in_stack_fffffffffffffa08,(uint32 *)in_stack_fffffffffffffa00);
    iVar7 = (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
    if (!(bool)local_2a5) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    *local_2b8 = local_2bc;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46836b);
    if (bVar1) {
      Reflection::AddEnumValue
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,iVar7);
    }
    else {
      Reflection::SetEnumValue
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,iVar7);
    }
    break;
  case TYPE_SFIXED32:
    local_118 = local_2e0;
    local_120 = &local_3ac;
    local_10d = io::CodedInputStream::ReadLittleEndian32
                          (in_stack_fffffffffffff9f8,(uint32 *)in_stack_fffffffffffff9f0);
    iVar6 = (int32)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
    if (!(bool)local_10d) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    *local_120 = local_124;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x467f15);
    if (bVar1) {
      Reflection::AddInt32
                (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                 (FieldDescriptor *)in_stack_fffffffffffffa10,
                 (int32)((ulong)in_stack_fffffffffffffa08 >> 0x20));
    }
    else {
      Reflection::SetInt32
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,iVar6);
    }
    break;
  case TYPE_SFIXED64:
    local_e0 = local_2e0;
    local_e8 = &local_3b8;
    local_d1 = io::CodedInputStream::ReadLittleEndian64
                         (in_stack_fffffffffffff9f8,(uint64 *)in_stack_fffffffffffff9f0);
    if (!(bool)local_d1) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    *local_e8 = local_f0;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x467fec);
    if (bVar1) {
      Reflection::AddInt64
                (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                 (FieldDescriptor *)in_stack_fffffffffffffa10,(int64)in_stack_fffffffffffffa08);
    }
    else {
      Reflection::SetInt64
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,(int64)in_stack_fffffffffffff9f8);
    }
    break;
  case TYPE_SINT32:
    local_210 = local_2e0;
    local_218 = &local_37c;
    local_205 = io::CodedInputStream::ReadVarint32
                          (in_stack_fffffffffffffa08,(uint32 *)in_stack_fffffffffffffa00);
    iVar6 = (int32)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
    if (!(bool)local_205) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    iVar9 = WireFormatLite::ZigZagDecode32(local_21c);
    *local_218 = iVar9;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x467abb);
    if (bVar1) {
      Reflection::AddInt32
                (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                 (FieldDescriptor *)in_stack_fffffffffffffa10,
                 (int32)((ulong)in_stack_fffffffffffffa08 >> 0x20));
    }
    else {
      Reflection::SetInt32
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,iVar6);
    }
    break;
  case MAX_TYPE:
    local_1d8 = local_2e0;
    local_1e0 = &local_388;
    local_1c9 = io::CodedInputStream::ReadVarint64
                          (in_stack_fffffffffffffa18,(uint64 *)in_stack_fffffffffffffa10);
    if (!(bool)local_1c9) {
      local_2bd = 0;
      goto LAB_00468af4;
    }
    iVar10 = WireFormatLite::ZigZagDecode64(local_1e8);
    *local_1e0 = iVar10;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x467b9a);
    if (bVar1) {
      Reflection::AddInt64
                (in_stack_fffffffffffffa20,(Message *)in_stack_fffffffffffffa18,
                 (FieldDescriptor *)in_stack_fffffffffffffa10,(int64)in_stack_fffffffffffffa08);
    }
    else {
      Reflection::SetInt64
                (in_stack_fffffffffffffa10,(Message *)in_stack_fffffffffffffa08,
                 (FieldDescriptor *)in_stack_fffffffffffffa00,(int64)in_stack_fffffffffffff9f8);
    }
  }
LAB_00468aec:
  local_2bd = 1;
LAB_00468af4:
  return (bool)(local_2bd & 1);
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32 tag,
    const FieldDescriptor* field,  // May be NULL for unknown
    Message* message, io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == NULL) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32 length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    while (input->BytesUntilLimit() > 0) {                                     \
      CPPTYPE value;                                                           \
      if (!WireFormatLite::ReadPrimitive<CPPTYPE,                              \
                                         WireFormatLite::TYPE_##TYPE>(input,   \
                                                                      &value)) \
        return false;                                                          \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);          \
    }                                                                          \
    break;                                                                     \
  }

      HANDLE_PACKED_TYPE(INT32, int32, Int32)
      HANDLE_PACKED_TYPE(INT64, int64, Int64)
      HANDLE_PACKED_TYPE(SINT32, int32, Int32)
      HANDLE_PACKED_TYPE(SINT64, int64, Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64, UInt64)

      HANDLE_PACKED_TYPE(FIXED32, uint32, UInt32)
      HANDLE_PACKED_TYPE(FIXED64, uint64, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32, int32, Int32)
      HANDLE_PACKED_TYPE(SFIXED64, int64, Int64)

      HANDLE_PACKED_TYPE(FLOAT, float, Float)
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (message->GetDescriptor()->file()->syntax() ==
              FileDescriptor::SYNTAX_PROTO3) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != NULL) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64 sign_extended_value = static_cast<int64>(value);
              message_reflection->MutableUnknownFields(message)->AddVarint(
                  WireFormatLite::GetTagFieldNumber(tag), sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    CPPTYPE value;                                                            \
    if (!WireFormatLite::ReadPrimitive<CPPTYPE, WireFormatLite::TYPE_##TYPE>( \
            input, &value))                                                   \
      return false;                                                           \
    if (field->is_repeated()) {                                               \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);         \
    } else {                                                                  \
      message_reflection->Set##CPPTYPE_METHOD(message, field, value);         \
    }                                                                         \
    break;                                                                    \
  }

      HANDLE_TYPE(INT32, int32, Int32)
      HANDLE_TYPE(INT64, int64, Int64)
      HANDLE_TYPE(SINT32, int32, Int32)
      HANDLE_TYPE(SINT64, int64, Int64)
      HANDLE_TYPE(UINT32, uint32, UInt32)
      HANDLE_TYPE(UINT64, uint64, UInt64)

      HANDLE_TYPE(FIXED32, uint32, UInt32)
      HANDLE_TYPE(FIXED64, uint64, UInt64)
      HANDLE_TYPE(SFIXED32, int32, Int32)
      HANDLE_TYPE(SFIXED64, int64, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;
        if (field->is_repeated()) {
          message_reflection->AddEnumValue(message, field, value);
        } else {
          message_reflection->SetEnumValue(message, field, value);
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        std::string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name().c_str())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        std::string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}